

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O1

bool __thiscall gui::TextBox::handleKeyPressed(TextBox *this,KeyEvent *key)

{
  String *this_00;
  Key KVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Signal<gui::Widget_*,_const_sf::String_&> *this_01;
  
  bVar3 = Widget::handleKeyPressed(&this->super_Widget,key);
  switch(key->code) {
  case Enter:
    this_01 = &this->onEnterPressed;
    goto LAB_001a6f69;
  case BackSpace:
    if (this->readOnly_ != false) {
      return true;
    }
    if (this->caretPosition_ == 0) {
      return true;
    }
    sVar5 = this->horizontalScroll_;
    if ((sVar5 != 0) &&
       (sVar4 = this->widthCharacters_, sVar6 = sf::String::getSize(&this->boxString_),
       sVar6 <= sVar5 + sVar4)) {
      this->horizontalScroll_ = this->horizontalScroll_ - 1;
    }
    sf::String::erase(&this->boxString_,this->caretPosition_ - 1,1);
    sVar5 = this->caretPosition_ - 1;
    break;
  case End:
    sVar5 = this->caretPosition_;
    sVar4 = sf::String::getSize(&this->boxString_);
    if (sVar5 != sVar4) {
      sVar5 = sf::String::getSize(&this->boxString_);
      goto LAB_001a7021;
    }
  default:
    KVar1 = key->code;
    sVar5 = this->caretPosition_;
    if (sVar5 == 0 || KVar1 != Home) {
      if (KVar1 == Right) {
        if ((this->readOnly_ != true) ||
           (sVar5 = this->widthCharacters_, sVar4 = this->horizontalScroll_,
           sVar6 = sf::String::getSize(&this->boxString_), sVar6 <= sVar5 + sVar4)) {
          if (this->readOnly_ != false) {
            return true;
          }
          uVar2 = this->caretPosition_;
          sVar5 = sf::String::getSize(&this->boxString_);
          if (uVar2 < sVar5) {
            updateCaretPosition(this,this->caretPosition_ + 1);
            return true;
          }
          return true;
        }
        sVar5 = this->horizontalScroll_ + this->widthCharacters_ + 1;
      }
      else {
        if (KVar1 != Left) {
          return bVar3;
        }
        if (this->readOnly_ == true) {
          if (this->horizontalScroll_ == 0) {
            return true;
          }
          sVar5 = this->horizontalScroll_ - 1;
        }
        else {
          if (sVar5 == 0) {
            return true;
          }
          sVar5 = sVar5 - 1;
        }
      }
    }
    else {
      sVar5 = 0;
    }
LAB_001a7021:
    updateCaretPosition(this,sVar5);
    return true;
  case Delete:
    if (this->readOnly_ != false) {
      return true;
    }
    uVar2 = this->caretPosition_;
    this_00 = &this->boxString_;
    sVar5 = sf::String::getSize(this_00);
    if (sVar5 <= uVar2) {
      return true;
    }
    sVar5 = sf::String::getSize(this_00);
    if (sVar5 == 0) {
      return true;
    }
    sVar5 = this->horizontalScroll_;
    if ((sVar5 != 0) &&
       (sVar4 = this->widthCharacters_, sVar6 = sf::String::getSize(this_00), sVar6 <= sVar5 + sVar4
       )) {
      this->horizontalScroll_ = this->horizontalScroll_ - 1;
    }
    sf::String::erase(this_00,this->caretPosition_,1);
    sVar5 = this->caretPosition_;
  }
  bVar3 = true;
  updateCaretPosition(this,sVar5);
  this_01 = &this->onTextChange;
LAB_001a6f69:
  Signal<gui::Widget_*,_const_sf::String_&>::emit(this_01,&this->super_Widget,&this->boxString_);
  return bVar3;
}

Assistant:

bool TextBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    if (key.code == sf::Keyboard::Enter) {
        onEnterPressed.emit(this, boxString_);
        return eventConsumed;
    } else if (key.code == sf::Keyboard::Backspace) {
        if (!readOnly_ && caretPosition_ > 0) {
            if (horizontalScroll_ > 0 && horizontalScroll_ + widthCharacters_ >= boxString_.getSize()) {
                --horizontalScroll_;
            }
            boxString_.erase(caretPosition_ - 1, 1);
            updateCaretPosition(caretPosition_ - 1);
            onTextChange.emit(this, boxString_);
        }
    } else if (key.code == sf::Keyboard::Delete) {
        if (!readOnly_ && caretPosition_ < boxString_.getSize() && boxString_.getSize() > 0) {
            if (horizontalScroll_ > 0 && horizontalScroll_ + widthCharacters_ >= boxString_.getSize()) {
                --horizontalScroll_;
            }
            boxString_.erase(caretPosition_, 1);
            updateCaretPosition(caretPosition_);
            onTextChange.emit(this, boxString_);
        }
    } else if (key.code == sf::Keyboard::End && caretPosition_ != boxString_.getSize()) {
        updateCaretPosition(boxString_.getSize());
    } else if (key.code == sf::Keyboard::Home && caretPosition_ != 0) {
        updateCaretPosition(0);
    } else if (key.code == sf::Keyboard::Left) {
        if (readOnly_ && horizontalScroll_ > 0) {
            updateCaretPosition(horizontalScroll_ - 1);
        } else if (!readOnly_ && caretPosition_ > 0) {
            updateCaretPosition(caretPosition_ - 1);
        }
    } else if (key.code == sf::Keyboard::Right) {
        if (readOnly_ && horizontalScroll_ + widthCharacters_ < boxString_.getSize()) {
            updateCaretPosition(horizontalScroll_ + widthCharacters_ + 1);
        } else if (!readOnly_ && caretPosition_ < boxString_.getSize()) {
            updateCaretPosition(caretPosition_ + 1);
        }
    } else {
        return eventConsumed;
    }
    return true;
}